

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool google::protobuf::anon_unknown_0::IsMapFieldInApi(FieldDescriptor *field)

{
  bool bVar1;
  
  bVar1 = FieldDescriptor::is_map(field);
  return bVar1;
}

Assistant:

bool IsMapFieldInApi(const FieldDescriptor* field) { return field->is_map(); }